

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastGtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  EpsCopyInputStream *pEVar3;
  ParseContext *pPVar4;
  byte bVar5;
  bool bVar6;
  unsigned_short uVar7;
  uint16_t uVar8;
  uint uVar9;
  int iVar10;
  uint32_t uVar11;
  int iVar12;
  char *pcVar13;
  uint *puVar14;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar15;
  FieldAux *pFVar16;
  MessageLite *pMVar17;
  EpsCopyInputStream *this;
  TailCallParseFunc p_Var18;
  LogMessage *pLVar19;
  undefined1 auVar20 [16];
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_class_24_3_cc722eaf inner_loop;
  TcParseTableBase *inner_table;
  FieldAux aux;
  MessageLite **field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1a0;
  unsigned_short saved_tag;
  uint64_t local_198;
  TcParseTableBase *local_190;
  ParseContext *local_188;
  char *local_180;
  MessageLite *local_178;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_170 [2];
  uint local_15c;
  TcParseTableBase *pTStack_158;
  uint32_t has_bits_offset;
  ulong local_150;
  MessageLite *local_148;
  Arena *local_140;
  TcParseTableBase *local_138;
  undefined1 local_130 [16];
  LogMessageFatal local_120 [23];
  Voidify local_109;
  string *local_108;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_f8;
  LogMessageFatal local_f0 [23];
  Voidify local_d9;
  string *local_d8;
  string *absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_bc;
  char *local_b8;
  ParseContext *local_b0;
  char *local_a8;
  char *local_a0;
  TcFieldData *local_98;
  TcFieldData local_90;
  EpsCopyInputStream *local_88;
  ParseContext *local_80;
  char *local_78;
  MessageLite *local_70;
  char *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_198 = hasbits;
  local_190 = table;
  local_188 = ctx;
  local_180 = ptr;
  local_178 = msg;
  local_170[0] = data.field_0;
  uVar7 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)local_170);
  pMVar17 = local_178;
  pcVar13 = local_180;
  pPVar2 = local_188;
  if (uVar7 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe60);
    pcVar13 = MiniParse(pMVar17,pcVar13,pPVar2,(TcFieldData)aStack_1a0,local_190,local_198);
    return pcVar13;
  }
  uVar7 = UnalignedLoad<unsigned_short>(local_180);
  local_180 = local_180 + 2;
  bVar5 = TcFieldData::hasbit_idx((TcFieldData *)local_170);
  local_198 = 1L << (bVar5 & 0x3f) | local_198;
  local_148 = local_178;
  pTStack_158 = local_190;
  local_15c = (uint)local_190->has_bits_offset;
  local_150 = local_198;
  if (local_15c != 0) {
    uVar9 = (uint)local_198;
    puVar14 = RefAt<unsigned_int>(local_178,(ulong)local_15c);
    *puVar14 = uVar9 | *puVar14;
  }
  pMVar17 = local_178;
  uVar8 = TcFieldData::offset((TcFieldData *)local_170);
  aVar15 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           RefAt<google::protobuf::MessageLite*>(pMVar17,(ulong)uVar8);
  pTVar1 = local_190;
  bVar5 = TcFieldData::aux_idx((TcFieldData *)local_170);
  pFVar16 = TcParseTableBase::field_aux(pTVar1,(uint)bVar5);
  pTVar1 = pFVar16->table;
  inner_loop.inner_table = (TcParseTableBase **)pTVar1;
  if (*(MessageLite **)aVar15 == (MessageLite *)0x0) {
    local_140 = MessageLite::GetArena(local_178);
    local_138 = pTVar1;
    pMVar17 = ClassData::New(pTVar1->class_data,local_140);
    *(MessageLite **)aVar15 = pMVar17;
  }
  pcVar13 = local_180;
  pPVar2 = local_188;
  inner_loop.field = (MessageLite **)&local_188;
  inner_loop.ctx = (ParseContext **)&inner_loop.inner_table;
  data_local.field_0 = aVar15;
  local_bc = FastDecodeTag(uVar7);
  local_b0 = pPVar2;
  local_b8 = pcVar13;
  _old_group_depth = &data_local;
  iVar10 = pPVar2->depth_ + -1;
  pPVar2->depth_ = iVar10;
  if (iVar10 < 0) {
    local_a8 = (char *)0x0;
  }
  else {
    pPVar2->group_depth_ = pPVar2->group_depth_ + 1;
    absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
    absl_log_internal_check_op_result._0_4_ = pPVar2->group_depth_;
    local_a0 = pcVar13;
    local_70 = *(MessageLite **)data_local.field_0;
    local_80 = (ParseContext *)*inner_loop.field;
    local_78 = pcVar13;
    local_88 = (EpsCopyInputStream *)
               (((*inner_loop.ctx)->super_EpsCopyInputStream).patch_buffer_ + 0x10);
    local_98 = _old_group_depth;
    while (bVar6 = ParseContext::Done(local_80,&local_78), pMVar17 = local_70, pcVar13 = local_78,
          pPVar4 = local_80, ((bVar6 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_90);
      pEVar3 = local_88;
      this = (EpsCopyInputStream *)((long)local_88 + -0x38);
      uVar7 = UnalignedLoad<unsigned_short>(pcVar13);
      if (((long)(int)((uint)uVar7 & (uint)*(byte *)((long)pEVar3 + -0x30)) & 7U) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry
                     ((TcParseTableBase *)this,
                      (ulong)(long)(int)((uint)uVar7 & (uint)*(byte *)((long)pEVar3 + -0x30)) >> 3);
      local_58.data =
           (ulong)uVar7 ^
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data;
      p_Var18 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_60.data = local_58.data;
      local_78 = (*p_Var18)(pMVar17,pcVar13,pPVar4,(TcFieldData)local_58,(TcParseTableBase *)this,0)
      ;
      if ((local_78 == (char *)0x0) ||
         (uVar11 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar11 != 1))
      break;
    }
    if ((*(byte *)((long)local_88 + -0x2f) & 1) == 0) {
      local_68 = local_78;
      local_88 = (EpsCopyInputStream *)((long)local_88 + -0x38);
    }
    else {
      pcVar13 = (char *)((long)local_88 + -0x10);
      local_88 = (EpsCopyInputStream *)((long)local_88 + -0x38);
      local_68 = (char *)(**(code **)pcVar13)(local_70,local_78,local_80);
    }
    local_b8 = local_68;
    if (local_68 != (char *)0x0) {
      iVar10 = absl::lts_20240722::log_internal::GetReferenceableValue
                         (absl_log_internal_check_op_result._4_4_);
      iVar12 = absl::lts_20240722::log_internal::GetReferenceableValue(pPVar2->depth_);
      local_d8 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                           (iVar10,iVar12,"old_depth == depth_");
      if (local_d8 != (string *)0x0) {
        auVar20 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
        local_f8 = auVar20._8_8_;
        absl_log_internal_check_op_result_1 = auVar20._0_8_;
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x45b,absl_log_internal_check_op_result_1,local_f8);
        pLVar19 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                            ((LogMessage *)local_f0);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_d9,pLVar19);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_f0);
      }
      iVar10 = absl::lts_20240722::log_internal::GetReferenceableValue
                         ((int)absl_log_internal_check_op_result);
      iVar12 = absl::lts_20240722::log_internal::GetReferenceableValue(pPVar2->group_depth_);
      local_108 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                            (iVar10,iVar12,"old_group_depth == group_depth_");
      if (local_108 != (string *)0x0) {
        local_130 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_108);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_120,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x45c,local_130._0_8_,local_130._8_8_);
        pLVar19 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                            ((LogMessage *)local_120);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_109,pLVar19);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_120);
      }
      local_108 = (string *)0x0;
    }
    pPVar2->group_depth_ = pPVar2->group_depth_ + -1;
    pPVar2->depth_ = pPVar2->depth_ + 1;
    bVar6 = EpsCopyInputStream::ConsumeEndGroup(&pPVar2->super_EpsCopyInputStream,local_bc);
    if (((bVar6 ^ 0xffU) & 1) == 0) {
      local_a8 = local_b8;
    }
    else {
      local_a8 = (char *)0x0;
    }
  }
  return local_a8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}